

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O0

bool __thiscall gnilk::IPCFifoUnix::Available(IPCFifoUnix *this)

{
  int iVar1;
  pollfd local_20;
  pollfd pfd;
  IPCFifoUnix *this_local;
  
  local_20.fd = this->rwfd;
  local_20.events = 1;
  local_20.revents = 0;
  pfd = (pollfd)this;
  iVar1 = poll(&local_20,1,0);
  return iVar1 == 1;
}

Assistant:

bool IPCFifoUnix::Available() {
    struct pollfd pfd {
            .fd = rwfd,
            .events = POLLIN,
            .revents = {},
    };

    // Non-blocking poll...
    if (poll(&pfd, 1, 0)==1) {
        return true;
    }
    return false;
}